

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

StringView __thiscall anon_unknown.dwarf_4f39de::Db::parseNumber(Db *this,bool AllowNegative)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  StringView SVar4;
  
  pcVar2 = this->First;
  pcVar1 = this->Last;
  pcVar3 = pcVar2;
  if ((pcVar2 != pcVar1 && AllowNegative) && (*pcVar2 == 'n')) {
    pcVar3 = pcVar2 + 1;
    this->First = pcVar3;
  }
  if ((pcVar1 == pcVar3) || (9 < (int)*pcVar3 - 0x30U)) {
    pcVar2 = (char *)0x0;
    pcVar3 = (char *)0x0;
  }
  else {
    while ((pcVar3 != pcVar1 && ((int)*pcVar3 - 0x30U < 10))) {
      pcVar3 = pcVar3 + 1;
      this->First = pcVar3;
    }
  }
  SVar4.Last = pcVar3;
  SVar4.First = pcVar2;
  return SVar4;
}

Assistant:

StringView Db::parseNumber(bool AllowNegative) {
  const char *Tmp = First;
  if (AllowNegative)
    consumeIf('n');
  if (numLeft() == 0 || !std::isdigit(*First))
    return StringView();
  while (numLeft() != 0 && std::isdigit(*First))
    ++First;
  return StringView(Tmp, First);
}